

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_sorter.cpp
# Opt level: O1

void __thiscall
duckdb::MergeSorter::FlushBlobs
          (MergeSorter *this,RowLayout *layout,idx_t *source_count,data_ptr_t *source_data_ptr,
          idx_t *source_entry_idx,data_ptr_t *source_heap_ptr,RowDataBlock *target_data_block,
          data_ptr_t *target_data_ptr,RowDataBlock *target_heap_block,
          BufferHandle *target_heap_handle,data_ptr_t *target_heap_ptr,idx_t *copied,idx_t *count)

{
  uint uVar1;
  idx_t iVar2;
  idx_t iVar3;
  idx_t iVar4;
  ulong uVar5;
  uint *puVar6;
  long lVar7;
  idx_t new_capacity;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  
  iVar2 = *copied;
  uVar9 = target_data_block->capacity - target_data_block->count;
  uVar5 = *count - iVar2;
  if (uVar5 < uVar9) {
    uVar9 = uVar5;
  }
  iVar3 = layout->row_width;
  iVar4 = layout->heap_pointer_offset;
  uVar5 = *source_count - *source_entry_idx;
  if (uVar9 < *source_count - *source_entry_idx) {
    uVar5 = uVar9;
  }
  sVar8 = uVar5 * iVar3;
  switchD_00b1422a::default(*target_data_ptr,*source_data_ptr,sVar8);
  *source_data_ptr = *source_data_ptr + sVar8;
  target_data_block->count = target_data_block->count + uVar5;
  lVar10 = (uVar5 + iVar2) - *copied;
  if (lVar10 == 0) {
    sVar8 = 0;
  }
  else {
    puVar6 = (uint *)*source_heap_ptr;
    lVar7 = lVar10 + (ulong)(lVar10 == 0);
    sVar8 = 0;
    do {
      *(idx_t *)(*target_data_ptr + iVar4) = target_heap_block->byte_offset + sVar8;
      *target_data_ptr = *target_data_ptr + iVar3;
      uVar1 = *puVar6;
      puVar6 = (uint *)((long)puVar6 + (ulong)uVar1);
      sVar8 = sVar8 + uVar1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  uVar9 = target_heap_block->byte_offset + sVar8;
  if (target_heap_block->capacity < uVar9) {
    (*this->buffer_manager->_vptr_BufferManager[6])(this->buffer_manager,target_heap_block,uVar9);
    target_heap_block->capacity = uVar9;
    optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&target_heap_handle->node);
    *target_heap_ptr = ((target_heap_handle->node).ptr)->buffer + target_heap_block->byte_offset;
  }
  switchD_00b1422a::default(*target_heap_ptr,*source_heap_ptr,sVar8);
  *target_heap_ptr = *target_heap_ptr + sVar8;
  *source_heap_ptr = *source_heap_ptr + sVar8;
  *source_entry_idx = *source_entry_idx + lVar10;
  *copied = *copied + lVar10;
  target_heap_block->count = target_heap_block->count + lVar10;
  target_heap_block->byte_offset = target_heap_block->byte_offset + sVar8;
  return;
}

Assistant:

void MergeSorter::FlushBlobs(const RowLayout &layout, const idx_t &source_count, data_ptr_t &source_data_ptr,
                             idx_t &source_entry_idx, data_ptr_t &source_heap_ptr, RowDataBlock &target_data_block,
                             data_ptr_t &target_data_ptr, RowDataBlock &target_heap_block,
                             BufferHandle &target_heap_handle, data_ptr_t &target_heap_ptr, idx_t &copied,
                             const idx_t &count) {
	const idx_t row_width = layout.GetRowWidth();
	const idx_t heap_pointer_offset = layout.GetHeapOffset();
	idx_t source_entry_idx_copy = source_entry_idx;
	data_ptr_t target_data_ptr_copy = target_data_ptr;
	idx_t copied_copy = copied;
	// Flush row data
	FlushRows(source_data_ptr, source_entry_idx_copy, source_count, target_data_block, target_data_ptr_copy, row_width,
	          copied_copy, count);
	const idx_t flushed = copied_copy - copied;
	// Compute the entry sizes and number of heap bytes that will be copied
	idx_t copy_bytes = 0;
	data_ptr_t source_heap_ptr_copy = source_heap_ptr;
	for (idx_t i = 0; i < flushed; i++) {
		// Store base heap offset in the row data
		Store<idx_t>(target_heap_block.byte_offset + copy_bytes, target_data_ptr + heap_pointer_offset);
		target_data_ptr += row_width;
		// Compute entry size and add to total
		auto entry_size = Load<uint32_t>(source_heap_ptr_copy);
		D_ASSERT(entry_size >= sizeof(uint32_t));
		source_heap_ptr_copy += entry_size;
		copy_bytes += entry_size;
	}
	// Reallocate result heap block size (if needed)
	if (target_heap_block.byte_offset + copy_bytes > target_heap_block.capacity) {
		idx_t new_capacity = target_heap_block.byte_offset + copy_bytes;
		buffer_manager.ReAllocate(target_heap_block.block, new_capacity);
		target_heap_block.capacity = new_capacity;
		target_heap_ptr = target_heap_handle.Ptr() + target_heap_block.byte_offset;
	}
	D_ASSERT(target_heap_block.byte_offset + copy_bytes <= target_heap_block.capacity);
	// Copy the heap data in one go
	memcpy(target_heap_ptr, source_heap_ptr, copy_bytes);
	target_heap_ptr += copy_bytes;
	source_heap_ptr += copy_bytes;
	source_entry_idx += flushed;
	copied += flushed;
	// Update result indices and pointers
	target_heap_block.count += flushed;
	target_heap_block.byte_offset += copy_bytes;
	D_ASSERT(target_heap_block.byte_offset <= target_heap_block.capacity);
}